

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O2

void __thiscall
density::detail::
LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
::Consume::clean_dead_elements(Consume *this)

{
  while ((*(uint *)(this + 0x10) & 3) == 2) {
    advance_head(this);
    move_next(this);
  }
  return;
}

Assistant:

void clean_dead_elements() noexcept
                {
                    while ((m_next_ptr & (LfQueue_Busy | LfQueue_Dead)) == LfQueue_Dead)
                    {
                        advance_head();
                        move_next();
                    }
                }